

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_palette.hpp
# Opt level: O0

ByteArray * __thiscall
ColorPalette<6UL>::to_bytes(ByteArray *__return_storage_ptr__,ColorPalette<6UL> *this)

{
  uint16_t word;
  const_iterator pvVar1;
  Color *color;
  const_iterator __end0;
  const_iterator __begin0;
  ColorPalette<6UL> *__range2;
  ColorPalette<6UL> *this_local;
  ByteArray *bytes;
  
  ByteArray::ByteArray(__return_storage_ptr__);
  __end0 = std::array<Color,_6UL>::begin(&this->super_array<Color,_6UL>);
  pvVar1 = std::array<Color,_6UL>::end(&this->super_array<Color,_6UL>);
  for (; __end0 != pvVar1; __end0 = __end0 + 1) {
    word = Color::to_bgr_word(__end0);
    ByteArray::add_word(__return_storage_ptr__,word);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] ByteArray to_bytes() const
    {
        ByteArray bytes;
        for(const Color& color : *this)
            bytes.add_word(color.to_bgr_word());
        return bytes;
    }